

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerCPP::emit_uniform(CompilerCPP *this,SPIRVariable *var)

{
  uint32_t uVar1;
  SPIRType *type_00;
  mapped_type *pmVar2;
  spirv_cross local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  spirv_cross local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  string local_80 [8];
  string type_name;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t location;
  uint32_t binding;
  uint32_t local_44;
  string local_40 [4];
  uint32_t descriptor_set;
  string instance_name;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_40,this,(ulong)uVar1,1);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_44 = (pmVar2->decoration).set;
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_58 = (pmVar2->decoration).binding;
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  local_5c = (pmVar2->decoration).location;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(local_80,this,type_00,0);
  Compiler::remap_variable_type_name((Compiler *)this,type_00,local_40,local_80);
  if (((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) ||
      (*(int *)&(type_00->super_IVariant).field_0xc == 0x11)) ||
     (*(int *)&(type_00->super_IVariant).field_0xc == 0xb)) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(local_a0,this,type_00);
    CompilerGLSL::
    statement<char_const(&)[20],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,(char (*) [20])"internal::Resource<",local_80,local_a0,
               (char (*) [3])0x5e9b23,local_40,(char (*) [4])"__;");
    ::std::__cxx11::string::~string((string *)local_a0);
    CompilerGLSL::
    statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",local_40,(char (*) [9])" __res->",
               local_40,(char (*) [9])"__.get()");
    join<char_const(&)[21],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (local_c0,(char (*) [21])"s.register_resource(",local_40,(char (*) [3])0x5f54de,
               (char (*) [3])0x5fe6df,&local_44,(char (*) [3])0x5fe6df,&local_58,
               (char (*) [3])0x5e9b6f);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&this->resource_registrations,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    ::std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(local_e0,this,type_00);
    CompilerGLSL::
    statement<char_const(&)[27],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
              (&this->super_CompilerGLSL,(char (*) [27])"internal::UniformConstant<",local_80,
               local_e0,(char (*) [3])0x5e9b23,local_40,(char (*) [4])"__;");
    ::std::__cxx11::string::~string((string *)local_e0);
    CompilerGLSL::
    statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[9]>
              (&this->super_CompilerGLSL,(char (*) [9])"#define ",local_40,(char (*) [9])" __res->",
               local_40,(char (*) [9])"__.get()");
    join<char_const(&)[29],std::__cxx11::string&,char_const(&)[3],char_const(&)[3],unsigned_int&,char_const(&)[3]>
              (local_100,(char (*) [29])"s.register_uniform_constant(",local_40,
               (char (*) [3])0x5f54de,(char (*) [3])0x5fe6df,&local_5c,(char (*) [3])0x5e9b6f);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&this->resource_registrations,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    ::std::__cxx11::string::~string((string *)local_100);
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x5df766);
  ::std::__cxx11::string::~string((string *)local_80);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerCPP::emit_uniform(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto instance_name = to_name(var.self);

	uint32_t descriptor_set = ir.meta[var.self].decoration.set;
	uint32_t binding = ir.meta[var.self].decoration.binding;
	uint32_t location = ir.meta[var.self].decoration.location;

	string type_name = type_to_glsl(type);
	remap_variable_type_name(type, instance_name, type_name);

	if (type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	    type.basetype == SPIRType::AtomicCounter)
	{
		statement("internal::Resource<", type_name, type_to_array_glsl(type), "> ", instance_name, "__;");
		statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
		resource_registrations.push_back(
		    join("s.register_resource(", instance_name, "__", ", ", descriptor_set, ", ", binding, ");"));
	}
	else
	{
		statement("internal::UniformConstant<", type_name, type_to_array_glsl(type), "> ", instance_name, "__;");
		statement_no_indent("#define ", instance_name, " __res->", instance_name, "__.get()");
		resource_registrations.push_back(
		    join("s.register_uniform_constant(", instance_name, "__", ", ", location, ");"));
	}

	statement("");
}